

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64BaseInfo.c
# Opt level: O2

char * utostr(uint64_t X,_Bool isNeg)

{
  char *pcVar1;
  char Buffer [22];
  
  Buffer[0x15] = '\0';
  if (X == 0) {
    pcVar1 = Buffer + 0x14;
    Buffer[0x14] = '0';
  }
  else {
    pcVar1 = Buffer + 0x15;
  }
  for (; X != 0; X = X / 10) {
    pcVar1[-1] = (byte)(X % 10) | 0x30;
    pcVar1 = pcVar1 + -1;
  }
  pcVar1 = cs_strdup(pcVar1);
  return pcVar1;
}

Assistant:

static char *utostr(uint64_t X, bool isNeg)
{
	char Buffer[22];
	char *BufPtr = Buffer+21;
	char *result;

	Buffer[21] = '\0';
	if (X == 0) *--BufPtr = '0';  // Handle special case...

	while (X) {
		*--BufPtr = X % 10 + '0';
		X /= 10;
	}

	if (isNeg) *--BufPtr = '-';   // Add negative sign...

	result = cs_strdup(BufPtr);
	return result;
}